

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion>::~Stack
          (Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion> *this)

{
  RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top> *pRVar1;
  ulong uVar2;
  RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top> *f;
  
  f = (RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top> *)
      this->_cursor;
  while (pRVar1 = (RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>
                   *)this->_stack, f != pRVar1) {
    f = f + -0x24;
    CoproductImpl::
    RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>::
    switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>>::~DefaultImpl()::_lambda(auto:1)_1_>
              (f,(anon_class_8_1_8991fb9c)f);
  }
  if (f != (RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top> *)
           0x0) {
    uVar2 = this->_capacity * 0x24 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      *(undefined8 *)pRVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar1;
    }
    else if (uVar2 < 0x11) {
      *(undefined8 *)pRVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pRVar1;
    }
    else if (uVar2 < 0x19) {
      *(undefined8 *)pRVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pRVar1;
    }
    else if (uVar2 < 0x21) {
      *(undefined8 *)pRVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pRVar1;
    }
    else if (uVar2 < 0x31) {
      *(undefined8 *)pRVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pRVar1;
    }
    else {
      if (0x40 < uVar2) {
        operator_delete(pRVar1,0x10);
        return;
      }
      *(undefined8 *)pRVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pRVar1;
    }
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }